

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

SimpleString __thiscall SimpleString::subString(SimpleString *this,size_t beginPos,size_t amount)

{
  size_t sVar1;
  size_t sVar2;
  ulong in_RCX;
  ulong in_RDX;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  SimpleString *in_RSI;
  SimpleString *in_RDI;
  SimpleString SVar3;
  SimpleString *newString;
  SimpleString *this_00;
  
  this_00 = in_RDI;
  sVar1 = size((SimpleString *)0x171a5d);
  if (sVar1 - 1 < in_RDX) {
    SimpleString(this_00,(char *)in_RDI);
    sVar1 = extraout_RDX;
  }
  else {
    getBuffer(in_RSI);
    SimpleString(this_00,(char *)in_RDI);
    sVar2 = size((SimpleString *)0x171aa9);
    sVar1 = extraout_RDX_00;
    if (in_RCX < sVar2) {
      in_RDI->buffer_[in_RCX] = '\0';
    }
  }
  SVar3.bufferSize_ = sVar1;
  SVar3.buffer_ = (char *)this_00;
  return SVar3;
}

Assistant:

SimpleString SimpleString::subString(size_t beginPos, size_t amount) const
{
    if (beginPos > size()-1) return "";

    SimpleString newString = getBuffer() + beginPos;

    if (newString.size() > amount)
        newString.buffer_[amount] = '\0';

    return newString;
}